

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
numeric_specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
::check_sign(numeric_specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
             *this)

{
  type tVar1;
  dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
  *pdVar2;
  char *message;
  
  tVar1 = this->arg_type_;
  if (tVar1 - int_type < 0xb) {
    if ((7 < tVar1 - int_type) || ((tVar1 < float_type && ((0x10aU >> (tVar1 & 0x1f) & 1) != 0)))) {
      return;
    }
    pdVar2 = this->error_handler_;
    message = "format specifier requires signed argument";
  }
  else {
    pdVar2 = this->error_handler_;
    message = "format specifier requires numeric argument";
  }
  error_handler::on_error((error_handler *)pdVar2->context_,message);
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }